

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::unroll_array_from_complex_load
          (CompilerGLSL *this,uint32_t target_id,uint32_t source_id,string *expr)

{
  BaseType expr_type;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  SPIRVariable *var_00;
  SPIRType *pSVar5;
  bool *pbVar6;
  uint *puVar7;
  CompilerError *this_00;
  char *ts_1;
  char (*in_R8) [10];
  bool local_293;
  string local_288;
  string local_268;
  undefined1 local_248 [8];
  SPIRType target_type;
  string local_d8;
  undefined1 local_b8 [8];
  string array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string new_expr;
  bool is_sample_mask;
  bool is_patch;
  bool is_tess;
  bool is_builtin;
  BuiltIn builtin;
  SPIRType *type;
  SPIRVariable *var;
  string *expr_local;
  uint32_t source_id_local;
  uint32_t target_id_local;
  CompilerGLSL *this_local;
  
  if (((((this->backend).force_gl_in_out_block & 1U) != 0) &&
      (expr_local._0_4_ = source_id, expr_local._4_4_ = target_id, _source_id_local = this,
      var_00 = Compiler::maybe_get<diligent_spirv_cross::SPIRVariable>
                         (&this->super_Compiler,source_id), var_00 != (SPIRVariable *)0x0)) &&
     ((var_00->storage == Input || (var_00->storage == Output)))) {
    pSVar5 = Compiler::get_variable_data_type(&this->super_Compiler,var_00);
    bVar1 = VectorView<unsigned_int>::empty(&(pSVar5->array).super_VectorView<unsigned_int>);
    if (!bVar1) {
      uVar4 = Compiler::get_decoration
                        (&this->super_Compiler,(ID)(var_00->super_IVariant).self.id,BuiltIn);
      bVar2 = Compiler::is_builtin_variable(&this->super_Compiler,var_00);
      bVar1 = false;
      if (((bVar2) && (bVar1 = true, uVar4 != 1)) && (bVar1 = true, uVar4 != 0)) {
        bVar1 = uVar4 == 0x14;
      }
      bVar2 = Compiler::is_tessellation_shader(&this->super_Compiler);
      bVar3 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)(var_00->super_IVariant).self.id,DecorationPatch)
      ;
      local_293 = bVar1 && uVar4 == 0x14;
      new_expr.field_2._M_local_buf[0xf] = local_293;
      if ((!bVar3) && ((bVar1 || (bVar2)))) {
        join<char_const(&)[2],unsigned_int&,char_const(&)[10]>
                  ((string *)local_68,(diligent_spirv_cross *)0xf66026,
                   (char (*) [2])((long)&expr_local + 4),(uint *)"_unrolled",in_R8);
        (*(this->super_Compiler)._vptr_Compiler[0x1b])
                  (&local_88,this,pSVar5,(string *)local_68,(ulong)expr_local._4_4_);
        statement<std::__cxx11::string,char_const(&)[2]>(this,&local_88,(char (*) [2])0xf651e6);
        ::std::__cxx11::string::~string((string *)&local_88);
        ::std::__cxx11::string::string((string *)local_b8);
        pbVar6 = VectorView<bool>::back(&(pSVar5->array_size_literal).super_VectorView<bool>);
        if ((*pbVar6 & 1U) == 0) {
          puVar7 = VectorView<unsigned_int>::back(&(pSVar5->array).super_VectorView<unsigned_int>);
          to_expression_abi_cxx11_
                    ((string *)&target_type.member_name_cache._M_h._M_single_bucket,this,*puVar7,
                     true);
          ::std::__cxx11::string::operator=
                    ((string *)local_b8,
                     (string *)&target_type.member_name_cache._M_h._M_single_bucket);
          ::std::__cxx11::string::~string
                    ((string *)&target_type.member_name_cache._M_h._M_single_bucket);
        }
        else {
          puVar7 = VectorView<unsigned_int>::back(&(pSVar5->array).super_VectorView<unsigned_int>);
          convert_to_string<unsigned_int,_0>(&local_d8,puVar7);
          ::std::__cxx11::string::operator=((string *)local_b8,(string *)&local_d8);
          ::std::__cxx11::string::~string((string *)&local_d8);
          puVar7 = VectorView<unsigned_int>::back(&(pSVar5->array).super_VectorView<unsigned_int>);
          if (*puVar7 == 0) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"Cannot unroll an array copy from unsized array.");
            __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
        }
        ts_1 = "); i++)";
        statement<char_const(&)[25],std::__cxx11::string&,char_const(&)[8]>
                  (this,(char (*) [25])"for (int i = 0; i < int(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   (char (*) [8])"); i++)");
        begin_scope(this);
        if ((bVar1) && ((new_expr.field_2._M_local_buf[0xf] & 1U) == 0)) {
          statement<std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[2]>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_68,(char (*) [16])"[i] = gl_in[i].",expr,(char (*) [2])0xf651e6);
        }
        else if ((new_expr.field_2._M_local_buf[0xf] & 1U) == 0) {
          statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[5]>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_68,(char (*) [7])"[i] = ",expr,(char (*) [5])"[i];");
        }
        else {
          SPIRType::SPIRType((SPIRType *)local_248,OpTypeInt);
          target_type.super_IVariant.self.id = 7;
          expr_type = pSVar5->basetype;
          join<std::__cxx11::string&,char_const(&)[4]>
                    (&local_288,(diligent_spirv_cross *)expr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"[i]",
                     (char (*) [4])ts_1);
          bitcast_expression(&local_268,this,(SPIRType *)local_248,expr_type,&local_288);
          statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_68,(char (*) [7])"[i] = ",&local_268,(char (*) [2])0xf651e6);
          ::std::__cxx11::string::~string((string *)&local_268);
          ::std::__cxx11::string::~string((string *)&local_288);
          SPIRType::~SPIRType((SPIRType *)local_248);
        }
        end_scope(this);
        ::std::__cxx11::string::operator=((string *)expr,(string *)local_68);
        ::std::__cxx11::string::~string((string *)local_b8);
        ::std::__cxx11::string::~string((string *)local_68);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::unroll_array_from_complex_load(uint32_t target_id, uint32_t source_id, std::string &expr)
{
	if (!backend.force_gl_in_out_block)
		return;
	// This path is only relevant for GL backends.

	auto *var = maybe_get<SPIRVariable>(source_id);
	if (!var)
		return;

	if (var->storage != StorageClassInput && var->storage != StorageClassOutput)
		return;

	auto &type = get_variable_data_type(*var);
	if (type.array.empty())
		return;

	auto builtin = BuiltIn(get_decoration(var->self, DecorationBuiltIn));
	bool is_builtin = is_builtin_variable(*var) &&
	                  (builtin == BuiltInPointSize ||
	                   builtin == BuiltInPosition ||
	                   builtin == BuiltInSampleMask);
	bool is_tess = is_tessellation_shader();
	bool is_patch = has_decoration(var->self, DecorationPatch);
	bool is_sample_mask = is_builtin && builtin == BuiltInSampleMask;

	// Tessellation input arrays are special in that they are unsized, so we cannot directly copy from it.
	// We must unroll the array load.
	// For builtins, we couldn't catch this case normally,
	// because this is resolved in the OpAccessChain in most cases.
	// If we load the entire array, we have no choice but to unroll here.
	if (!is_patch && (is_builtin || is_tess))
	{
		auto new_expr = join("_", target_id, "_unrolled");
		statement(variable_decl(type, new_expr, target_id), ";");
		string array_expr;
		if (type.array_size_literal.back())
		{
			array_expr = convert_to_string(type.array.back());
			if (type.array.back() == 0)
				SPIRV_CROSS_THROW("Cannot unroll an array copy from unsized array.");
		}
		else
			array_expr = to_expression(type.array.back());

		// The array size might be a specialization constant, so use a for-loop instead.
		statement("for (int i = 0; i < int(", array_expr, "); i++)");
		begin_scope();
		if (is_builtin && !is_sample_mask)
			statement(new_expr, "[i] = gl_in[i].", expr, ";");
		else if (is_sample_mask)
		{
			SPIRType target_type { OpTypeInt };
			target_type.basetype = SPIRType::Int;
			statement(new_expr, "[i] = ", bitcast_expression(target_type, type.basetype, join(expr, "[i]")), ";");
		}
		else
			statement(new_expr, "[i] = ", expr, "[i];");
		end_scope();

		expr = std::move(new_expr);
	}
}